

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_int>::on_bin
          (int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_int>
           *this)

{
  char cVar1;
  basic_format_specs<char> *specs;
  size_t sVar2;
  bool bVar3;
  ulong uVar4;
  char *__dest;
  byte *pbVar5;
  uint uVar6;
  ulong __n;
  ptrdiff_t _Num;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  string_view prefix;
  write_int_data<char> data;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  buffer<char> *pbVar11;
  write_int_data<char> local_40;
  
  specs = this->specs;
  if ((char)specs->field_0x9 < '\0') {
    uVar6 = this->prefix_size;
    this->prefix_size = uVar6 + 1;
    this->prefix[uVar6] = '0';
    cVar1 = specs->type;
    uVar6 = this->prefix_size;
    this->prefix_size = uVar6 + 1;
    this->prefix[uVar6] = cVar1;
  }
  lVar9 = 0;
  uVar6 = this->abs_value;
  do {
    lVar9 = lVar9 + 1;
    bVar3 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar3);
  pbVar11 = (this->out).container;
  __n = (ulong)this->prefix_size;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  write_int_data<char>::write_int_data(&local_40,(int)lVar9,prefix,specs);
  uVar4 = (ulong)specs->width;
  if (-1 < (long)uVar4) {
    uVar10 = 0;
    if (local_40.size <= uVar4) {
      uVar10 = uVar4 - local_40.size;
    }
    uVar4 = uVar10 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    sVar2 = pbVar11->size_;
    uVar7 = local_40.size + sVar2 + (specs->fill).size_ * uVar10;
    if (pbVar11->capacity_ < uVar7) {
      (**pbVar11->_vptr_buffer)(pbVar11,uVar7);
    }
    pbVar11->size_ = uVar7;
    __dest = fill<char*,char>(pbVar11->ptr_ + sVar2,uVar4,&specs->fill);
    if (__n != 0) {
      memmove(__dest,this->prefix,__n);
      __dest = __dest + __n;
    }
    pcVar8 = __dest;
    if (local_40.padding != 0) {
      pcVar8 = __dest + local_40.padding;
      memset(__dest,0x30,local_40.padding);
    }
    pbVar5 = (byte *)(pcVar8 + lVar9);
    uVar6 = this->abs_value;
    do {
      pbVar5 = pbVar5 + -1;
      *pbVar5 = (byte)uVar6 & 1 | 0x30;
      bVar3 = 1 < uVar6;
      uVar6 = uVar6 >> 1;
    } while (bVar3);
    fill<char*,char>(pcVar8 + lVar9,uVar10 - uVar4,&specs->fill);
    (this->out).container = pbVar11;
    return;
  }
  assert_fail(in_stack_ffffffffffffff90,0,in_stack_ffffffffffffff88);
}

Assistant:

void on_bin() {
    if (specs.alt) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = static_cast<char>(specs.type);
    }
    int num_digits = count_digits<1>(abs_value);
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<1, Char>(it, abs_value, num_digits);
                    });
  }